

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

void __thiscall wasm::I64ToI32Lowering::I64ToI32Lowering(I64ToI32Lowering *this)

{
  I64ToI32Lowering *this_local;
  
  WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
  ::WalkerPass(&this->
                super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
              );
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)&PTR__I64ToI32Lowering_02717c98;
  std::unique_ptr<wasm::Builder,std::default_delete<wasm::Builder>>::
  unique_ptr<std::default_delete<wasm::Builder>,void>
            ((unique_ptr<wasm::Builder,std::default_delete<wasm::Builder>> *)&this->builder);
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::unordered_map(&this->indexMap);
  std::
  unordered_map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::unordered_map(&this->freeTemps);
  std::
  unordered_map<wasm::Expression_*,_wasm::I64ToI32Lowering::TempVar,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>_>_>
  ::unordered_map(&this->highBitVars);
  std::
  unordered_map<unsigned_int,_wasm::Type,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Type>_>_>
  ::unordered_map(&this->tempTypes);
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::unordered_set(&this->originallyI64Globals);
  return;
}

Assistant:

TempVar(Index idx, Type ty, I64ToI32Lowering& pass)
      : idx(idx), pass(pass), moved(false), ty(ty) {}